

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

MPP_RET vepu580_h265_set_rc_regs(H265eV580HalContext *ctx,H265eV580RegSet *regs,HalEncTask *task)

{
  EncRcTask *pEVar1;
  MppEncCfgSet *pMVar2;
  uint uVar3;
  uint uVar4;
  hevc_vepu580_rc_klut *phVar5;
  uint uVar6;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  RK_S32 positive_bits_thd;
  RK_S32 negative_bits_thd;
  RK_U32 ctu_target_bits;
  RK_U32 ctu_target_bits_mul_16;
  RK_S32 mb_h64;
  RK_S32 mb_wd64;
  MppEncH265Cfg *h265;
  MppEncCodecCfg *codec;
  MppEncHwCfg *hw;
  MppEncRcCfg *rc;
  MppEncCfgSet *cfg;
  hevc_vepu580_rc_klut *reg_rc;
  hevc_vepu580_base *reg_base;
  EncRcTaskInfo *rc_cfg;
  H265eSyntax_new *syn;
  HalEncTask *task_local;
  H265eV580RegSet *regs_local;
  H265eV580HalContext *ctx_local;
  
  pEVar1 = task->rc_task;
  phVar5 = &regs->reg_rc_klut;
  pMVar2 = ctx->cfg;
  uVar3 = ((ctx->syn->pp).pic_width + 0x3f) / 0x40;
  negative_bits_thd =
       ((pEVar1->info).bit_target << 4) / (int)(uVar3 * (((ctx->syn->pp).pic_height + 0x3f) / 0x40))
  ;
  if ((pMVar2->rc).rc_mode == MPP_ENC_RC_MODE_FIXQP) {
    (regs->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
         ((uint)(regs->reg_base).reg0192_enc_pic & 0xffffc0ff |
         ((pEVar1->info).quality_target & 0x3fU) << 8);
    (regs->reg_base).reg0240_synt_sli1 =
         (anon_struct_4_13_b789f5b8_for_reg0240_synt_sli1)
         ((uint)(regs->reg_base).reg0240_synt_sli1 & 0xffc0ffff |
         ((pEVar1->info).quality_target & 0x3fU) << 0x10);
    (regs->reg_base).reg213_rc_qp =
         (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
         ((uint)(regs->reg_base).reg213_rc_qp & 0xfc0fffff |
         ((pEVar1->info).quality_target & 0x3fU) << 0x14);
    (regs->reg_base).reg213_rc_qp =
         (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
         ((uint)(regs->reg_base).reg213_rc_qp & 0x3ffffff | (pEVar1->info).quality_target << 0x1a);
  }
  else {
    if (0xfffff < (uint)negative_bits_thd) {
      negative_bits_thd = 0x50000;
    }
    uVar4 = negative_bits_thd * uVar3 >> 4;
    uVar6 = uVar4 * 5 >> 4;
    uVar4 = uVar4 * 5 >> 4;
    (regs->reg_base).reg0192_enc_pic =
         (anon_struct_4_12_9a467a88_for_reg0192_enc_pic)
         ((uint)(regs->reg_base).reg0192_enc_pic & 0xffffc0ff |
         ((pEVar1->info).quality_target & 0x3fU) << 8);
    (regs->reg_base).reg0240_synt_sli1 =
         (anon_struct_4_13_b789f5b8_for_reg0240_synt_sli1)
         ((uint)(regs->reg_base).reg0240_synt_sli1 & 0xffc0ffff |
         ((pEVar1->info).quality_target & 0x3fU) << 0x10);
    (regs->reg_base).reg212_rc_cfg =
         (anon_struct_4_5_2c7276d0_for_reg212_rc_cfg)
         ((uint)(regs->reg_base).reg212_rc_cfg & 0xfffffffe | 1);
    (regs->reg_base).reg212_rc_cfg =
         (anon_struct_4_5_2c7276d0_for_reg212_rc_cfg)
         ((uint)(regs->reg_base).reg212_rc_cfg & 0xfffffffd | 2);
    (regs->reg_base).reg212_rc_cfg =
         (anon_struct_4_5_2c7276d0_for_reg212_rc_cfg)
         ((uint)(regs->reg_base).reg212_rc_cfg & 0xfffffffb | 4);
    (regs->reg_base).reg212_rc_cfg =
         (anon_struct_4_5_2c7276d0_for_reg212_rc_cfg)
         ((uint)(regs->reg_base).reg212_rc_cfg & 0xfff | uVar3 << 0xc);
    if (ctx->frame_type == 2) {
      local_84 = (pMVar2->hw).qp_delta_row_i;
    }
    else {
      local_84 = (pMVar2->hw).qp_delta_row;
    }
    (regs->reg_base).reg213_rc_qp =
         (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
         ((uint)(regs->reg_base).reg213_rc_qp & 0xfff0ffff | (local_84 & 0xf) << 0x10);
    (regs->reg_base).reg213_rc_qp =
         (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
         ((uint)(regs->reg_base).reg213_rc_qp & 0xfc0fffff |
         ((pEVar1->info).quality_max & 0x3fU) << 0x14);
    (regs->reg_base).reg213_rc_qp =
         (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
         ((uint)(regs->reg_base).reg213_rc_qp & 0x3ffffff | (pEVar1->info).quality_min << 0x1a);
    (regs->reg_base).reg214_rc_tgt =
         (anon_struct_4_2_26345f66_for_reg214_rc_tgt)
         ((uint)(regs->reg_base).reg214_rc_tgt & 0xfff00000 | negative_bits_thd & 0xfffffU);
    (regs->reg_rc_klut).rc_dthd_0_8[0] = uVar6 * -2;
    (regs->reg_rc_klut).rc_dthd_0_8[1] = -uVar6;
    (regs->reg_rc_klut).rc_dthd_0_8[2] = uVar4;
    (regs->reg_rc_klut).rc_dthd_0_8[3] = uVar4 << 1;
    (regs->reg_rc_klut).rc_dthd_0_8[4] = 0x7fffffff;
    (regs->reg_rc_klut).rc_dthd_0_8[5] = 0x7fffffff;
    (regs->reg_rc_klut).rc_dthd_0_8[6] = 0x7fffffff;
    (regs->reg_rc_klut).rc_dthd_0_8[7] = 0x7fffffff;
    (regs->reg_rc_klut).rc_dthd_0_8[8] = 0x7fffffff;
    phVar5->rc_adj0 =
         (anon_struct_4_6_300d8e3c_for_rc_adj0)((uint)phVar5->rc_adj0 & 0xffffffe0 | 0x1e);
    phVar5->rc_adj0 =
         (anon_struct_4_6_300d8e3c_for_rc_adj0)((uint)phVar5->rc_adj0 & 0xfffffc1f | 0x3e0);
    phVar5->rc_adj0 = (anon_struct_4_6_300d8e3c_for_rc_adj0)((uint)phVar5->rc_adj0 & 0xffff83ff);
    phVar5->rc_adj0 =
         (anon_struct_4_6_300d8e3c_for_rc_adj0)((uint)phVar5->rc_adj0 & 0xfff07fff | 0x8000);
    phVar5->rc_adj0 =
         (anon_struct_4_6_300d8e3c_for_rc_adj0)((uint)phVar5->rc_adj0 & 0xfe0fffff | 0x200000);
    (regs->reg_rc_klut).rc_adj1 =
         (anon_struct_4_5_b0b021a4_for_rc_adj1)((uint)(regs->reg_rc_klut).rc_adj1 & 0xffffffe0);
    (regs->reg_rc_klut).rc_adj1 =
         (anon_struct_4_5_b0b021a4_for_rc_adj1)((uint)(regs->reg_rc_klut).rc_adj1 & 0xfffffc1f);
    (regs->reg_rc_klut).rc_adj1 =
         (anon_struct_4_5_b0b021a4_for_rc_adj1)((uint)(regs->reg_rc_klut).rc_adj1 & 0xffff83ff);
    (regs->reg_rc_klut).rc_adj1 =
         (anon_struct_4_5_b0b021a4_for_rc_adj1)((uint)(regs->reg_rc_klut).rc_adj1 & 0xfff07fff);
    if ((pMVar2->rc).rc_mode == MPP_ENC_RC_MODE_SMTRC) {
      (regs->reg_base).reg213_rc_qp =
           (anon_struct_4_4_3197f2ce_for_reg213_rc_qp)
           ((uint)(regs->reg_base).reg213_rc_qp & 0xfff0ffff);
    }
  }
  if ((pMVar2->codec).field_1.h265.qpmin_map[0] == '\0') {
    local_88 = (pEVar1->info).quality_min;
  }
  else {
    local_88 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[0];
  }
  (regs->reg_rc_klut).roi_qthd0 =
       (anon_struct_4_6_4eb74e70_for_roi_qthd0)
       ((uint)(regs->reg_rc_klut).roi_qthd0 & 0xffffffc0 | local_88 & 0x3f);
  if ((pMVar2->codec).field_1.h265.qpmax_map[0] == '\0') {
    local_8c = (pEVar1->info).quality_max;
  }
  else {
    local_8c = (uint)(pMVar2->codec).field_1.h265.qpmax_map[0];
  }
  (regs->reg_rc_klut).roi_qthd0 =
       (anon_struct_4_6_4eb74e70_for_roi_qthd0)
       ((uint)(regs->reg_rc_klut).roi_qthd0 & 0xfffff03f | (local_8c & 0x3f) << 6);
  if ((pMVar2->codec).field_1.h265.qpmin_map[1] == '\0') {
    local_90 = (pEVar1->info).quality_min;
  }
  else {
    local_90 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[1];
  }
  (regs->reg_rc_klut).roi_qthd0 =
       (anon_struct_4_6_4eb74e70_for_roi_qthd0)
       ((uint)(regs->reg_rc_klut).roi_qthd0 & 0xfffc0fff | (local_90 & 0x3f) << 0xc);
  if ((pMVar2->codec).field_1.h265.qpmax_map[1] == '\0') {
    local_94 = (pEVar1->info).quality_max;
  }
  else {
    local_94 = (uint)(pMVar2->codec).field_1.h265.qpmax_map[1];
  }
  (regs->reg_rc_klut).roi_qthd0 =
       (anon_struct_4_6_4eb74e70_for_roi_qthd0)
       ((uint)(regs->reg_rc_klut).roi_qthd0 & 0xff03ffff | (local_94 & 0x3f) << 0x12);
  if ((pMVar2->codec).field_1.h265.qpmin_map[2] == '\0') {
    local_98 = (pEVar1->info).quality_min;
  }
  else {
    local_98 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[2];
  }
  (regs->reg_rc_klut).roi_qthd0 =
       (anon_struct_4_6_4eb74e70_for_roi_qthd0)
       ((uint)(regs->reg_rc_klut).roi_qthd0 & 0xc0ffffff | (local_98 & 0x3f) << 0x18);
  if ((pMVar2->codec).field_1.h265.qpmax_map[2] == '\0') {
    local_9c = (pEVar1->info).quality_max;
  }
  else {
    local_9c = (uint)(pMVar2->codec).field_1.h265.qpmax_map[2];
  }
  (regs->reg_rc_klut).roi_qthd1 =
       (anon_struct_4_6_35f7dd1a_for_roi_qthd1)
       ((uint)(regs->reg_rc_klut).roi_qthd1 & 0xffffffc0 | local_9c & 0x3f);
  if ((pMVar2->codec).field_1.h265.qpmin_map[3] == '\0') {
    local_a0 = (pEVar1->info).quality_min;
  }
  else {
    local_a0 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[3];
  }
  (regs->reg_rc_klut).roi_qthd1 =
       (anon_struct_4_6_35f7dd1a_for_roi_qthd1)
       ((uint)(regs->reg_rc_klut).roi_qthd1 & 0xfffff03f | (local_a0 & 0x3f) << 6);
  if ((pMVar2->codec).field_1.h265.qpmax_map[3] == '\0') {
    local_a4 = (pEVar1->info).quality_max;
  }
  else {
    local_a4 = (uint)(pMVar2->codec).field_1.h265.qpmax_map[3];
  }
  (regs->reg_rc_klut).roi_qthd1 =
       (anon_struct_4_6_35f7dd1a_for_roi_qthd1)
       ((uint)(regs->reg_rc_klut).roi_qthd1 & 0xfffc0fff | (local_a4 & 0x3f) << 0xc);
  if ((pMVar2->codec).field_1.h265.qpmin_map[4] == '\0') {
    local_a8 = (pEVar1->info).quality_min;
  }
  else {
    local_a8 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[4];
  }
  (regs->reg_rc_klut).roi_qthd1 =
       (anon_struct_4_6_35f7dd1a_for_roi_qthd1)
       ((uint)(regs->reg_rc_klut).roi_qthd1 & 0xff03ffff | (local_a8 & 0x3f) << 0x12);
  if ((pMVar2->codec).field_1.h265.qpmax_map[4] == '\0') {
    local_ac = (pEVar1->info).quality_max;
  }
  else {
    local_ac = (uint)(pMVar2->codec).field_1.h265.qpmax_map[4];
  }
  (regs->reg_rc_klut).roi_qthd1 =
       (anon_struct_4_6_35f7dd1a_for_roi_qthd1)
       ((uint)(regs->reg_rc_klut).roi_qthd1 & 0xc0ffffff | (local_ac & 0x3f) << 0x18);
  if ((pMVar2->codec).field_1.h265.qpmin_map[5] == '\0') {
    local_b0 = (pEVar1->info).quality_min;
  }
  else {
    local_b0 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[5];
  }
  (regs->reg_rc_klut).roi_qthd2 =
       (anon_struct_4_6_5788584b_for_roi_qthd2)
       ((uint)(regs->reg_rc_klut).roi_qthd2 & 0xffffffc0 | local_b0 & 0x3f);
  if ((pMVar2->codec).field_1.h265.qpmax_map[5] == '\0') {
    local_b4 = (pEVar1->info).quality_max;
  }
  else {
    local_b4 = (uint)(pMVar2->codec).field_1.h265.qpmax_map[5];
  }
  (regs->reg_rc_klut).roi_qthd2 =
       (anon_struct_4_6_5788584b_for_roi_qthd2)
       ((uint)(regs->reg_rc_klut).roi_qthd2 & 0xfffff03f | (local_b4 & 0x3f) << 6);
  if ((pMVar2->codec).field_1.h265.qpmin_map[6] == '\0') {
    local_b8 = (pEVar1->info).quality_min;
  }
  else {
    local_b8 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[6];
  }
  (regs->reg_rc_klut).roi_qthd2 =
       (anon_struct_4_6_5788584b_for_roi_qthd2)
       ((uint)(regs->reg_rc_klut).roi_qthd2 & 0xfffc0fff | (local_b8 & 0x3f) << 0xc);
  if ((pMVar2->codec).field_1.h265.qpmax_map[6] == '\0') {
    local_bc = (pEVar1->info).quality_max;
  }
  else {
    local_bc = (uint)(pMVar2->codec).field_1.h265.qpmax_map[6];
  }
  (regs->reg_rc_klut).roi_qthd2 =
       (anon_struct_4_6_5788584b_for_roi_qthd2)
       ((uint)(regs->reg_rc_klut).roi_qthd2 & 0xff03ffff | (local_bc & 0x3f) << 0x12);
  if ((pMVar2->codec).field_1.h265.qpmin_map[7] == '\0') {
    local_c0 = (pEVar1->info).quality_min;
  }
  else {
    local_c0 = (uint)(pMVar2->codec).field_1.h265.qpmin_map[7];
  }
  (regs->reg_rc_klut).roi_qthd2 =
       (anon_struct_4_6_5788584b_for_roi_qthd2)
       ((uint)(regs->reg_rc_klut).roi_qthd2 & 0xc0ffffff | (local_c0 & 0x3f) << 0x18);
  if ((pMVar2->codec).field_1.h265.qpmax_map[7] == '\0') {
    local_c4 = (pEVar1->info).quality_max;
  }
  else {
    local_c4 = (uint)(pMVar2->codec).field_1.h265.qpmax_map[7];
  }
  (regs->reg_rc_klut).roi_qthd3 =
       (anon_struct_4_3_5cb1a3b9_for_roi_qthd3)
       ((uint)(regs->reg_rc_klut).roi_qthd3 & 0xffffffc0 | local_c4 & 0x3f);
  (regs->reg_rc_klut).roi_qthd3 =
       (anon_struct_4_3_5cb1a3b9_for_roi_qthd3)
       ((uint)(regs->reg_rc_klut).roi_qthd3 & 0x3fffffff |
       (pMVar2->codec).field_1.h265.qpmap_mode << 0x1e);
  return MPP_OK;
}

Assistant:

static MPP_RET vepu580_h265_set_rc_regs(H265eV580HalContext *ctx, H265eV580RegSet *regs, HalEncTask *task)
{
    H265eSyntax_new *syn = ctx->syn;
    EncRcTaskInfo *rc_cfg = &task->rc_task->info;
    hevc_vepu580_base *reg_base = &regs->reg_base;
    hevc_vepu580_rc_klut *reg_rc = &regs->reg_rc_klut;
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncRcCfg *rc = &cfg->rc;
    MppEncHwCfg *hw = &cfg->hw;
    MppEncCodecCfg *codec = &cfg->codec;
    MppEncH265Cfg *h265 = &codec->h265;
    RK_S32 mb_wd64, mb_h64;
    mb_wd64 = (syn->pp.pic_width + 63) / 64;
    mb_h64 = (syn->pp.pic_height + 63) / 64;

    RK_U32 ctu_target_bits_mul_16 = (rc_cfg->bit_target << 4) / (mb_wd64 * mb_h64);
    RK_U32 ctu_target_bits;
    RK_S32 negative_bits_thd, positive_bits_thd;

    if (rc->rc_mode == MPP_ENC_RC_MODE_FIXQP) {
        reg_base->reg0192_enc_pic.pic_qp    = rc_cfg->quality_target;
        reg_base->reg0240_synt_sli1.sli_qp  = rc_cfg->quality_target;

        reg_base->reg213_rc_qp.rc_max_qp   = rc_cfg->quality_target;
        reg_base->reg213_rc_qp.rc_min_qp   = rc_cfg->quality_target;
    } else {
        if (ctu_target_bits_mul_16 >= 0x100000) {
            ctu_target_bits_mul_16 = 0x50000;
        }
        ctu_target_bits = (ctu_target_bits_mul_16 * mb_wd64) >> 4;
        negative_bits_thd = 0 - 5 * ctu_target_bits / 16;
        positive_bits_thd = 5 * ctu_target_bits / 16;

        reg_base->reg0192_enc_pic.pic_qp    = rc_cfg->quality_target;
        reg_base->reg0240_synt_sli1.sli_qp  = rc_cfg->quality_target;
        reg_base->reg212_rc_cfg.rc_en      = 1;
        reg_base->reg212_rc_cfg.aq_en  = 1;
        reg_base->reg212_rc_cfg.aq_mode    = 1;
        reg_base->reg212_rc_cfg.rc_ctu_num = mb_wd64;
        reg_base->reg213_rc_qp.rc_qp_range = (ctx->frame_type == INTRA_FRAME) ?
                                             hw->qp_delta_row_i : hw->qp_delta_row;
        reg_base->reg213_rc_qp.rc_max_qp   = rc_cfg->quality_max;
        reg_base->reg213_rc_qp.rc_min_qp   = rc_cfg->quality_min;
        reg_base->reg214_rc_tgt.ctu_ebit  = ctu_target_bits_mul_16;

        reg_rc->rc_dthd_0_8[0] = 2 * negative_bits_thd;
        reg_rc->rc_dthd_0_8[1] = negative_bits_thd;
        reg_rc->rc_dthd_0_8[2] = positive_bits_thd;
        reg_rc->rc_dthd_0_8[3] = 2 * positive_bits_thd;
        reg_rc->rc_dthd_0_8[4] = 0x7FFFFFFF;
        reg_rc->rc_dthd_0_8[5] = 0x7FFFFFFF;
        reg_rc->rc_dthd_0_8[6] = 0x7FFFFFFF;
        reg_rc->rc_dthd_0_8[7] = 0x7FFFFFFF;
        reg_rc->rc_dthd_0_8[8] = 0x7FFFFFFF;

        reg_rc->rc_adj0.qp_adj0    = -2;
        reg_rc->rc_adj0.qp_adj1    = -1;
        reg_rc->rc_adj0.qp_adj2    = 0;
        reg_rc->rc_adj0.qp_adj3    = 1;
        reg_rc->rc_adj0.qp_adj4    = 2;
        reg_rc->rc_adj1.qp_adj5    = 0;
        reg_rc->rc_adj1.qp_adj6    = 0;
        reg_rc->rc_adj1.qp_adj7    = 0;
        reg_rc->rc_adj1.qp_adj8    = 0;

        if (rc->rc_mode == MPP_ENC_RC_MODE_SMTRC) {
            reg_base->reg213_rc_qp.rc_qp_range = 0;
        }
    }

    reg_rc->roi_qthd0.qpmin_area0 = h265->qpmin_map[0] > 0 ? h265->qpmin_map[0] : rc_cfg->quality_min;
    reg_rc->roi_qthd0.qpmax_area0 = h265->qpmax_map[0] > 0 ? h265->qpmax_map[0] : rc_cfg->quality_max;
    reg_rc->roi_qthd0.qpmin_area1 = h265->qpmin_map[1] > 0 ? h265->qpmin_map[1] : rc_cfg->quality_min;
    reg_rc->roi_qthd0.qpmax_area1 = h265->qpmax_map[1] > 0 ? h265->qpmax_map[1] : rc_cfg->quality_max;
    reg_rc->roi_qthd0.qpmin_area2 = h265->qpmin_map[2] > 0 ? h265->qpmin_map[2] : rc_cfg->quality_min;
    reg_rc->roi_qthd1.qpmax_area2 = h265->qpmax_map[2] > 0 ? h265->qpmax_map[2] : rc_cfg->quality_max;
    reg_rc->roi_qthd1.qpmin_area3 = h265->qpmin_map[3] > 0 ? h265->qpmin_map[3] : rc_cfg->quality_min;
    reg_rc->roi_qthd1.qpmax_area3 = h265->qpmax_map[3] > 0 ? h265->qpmax_map[3] : rc_cfg->quality_max;
    reg_rc->roi_qthd1.qpmin_area4 = h265->qpmin_map[4] > 0 ? h265->qpmin_map[4] : rc_cfg->quality_min;
    reg_rc->roi_qthd1.qpmax_area4 = h265->qpmax_map[4] > 0 ? h265->qpmax_map[4] : rc_cfg->quality_max;
    reg_rc->roi_qthd2.qpmin_area5 = h265->qpmin_map[5] > 0 ? h265->qpmin_map[5] : rc_cfg->quality_min;
    reg_rc->roi_qthd2.qpmax_area5 = h265->qpmax_map[5] > 0 ? h265->qpmax_map[5] : rc_cfg->quality_max;
    reg_rc->roi_qthd2.qpmin_area6 = h265->qpmin_map[6] > 0 ? h265->qpmin_map[6] : rc_cfg->quality_min;
    reg_rc->roi_qthd2.qpmax_area6 = h265->qpmax_map[6] > 0 ? h265->qpmax_map[6] : rc_cfg->quality_max;
    reg_rc->roi_qthd2.qpmin_area7 = h265->qpmin_map[7] > 0 ? h265->qpmin_map[7] : rc_cfg->quality_min;
    reg_rc->roi_qthd3.qpmax_area7 = h265->qpmax_map[7] > 0 ? h265->qpmax_map[7] : rc_cfg->quality_max;
    reg_rc->roi_qthd3.qpmap_mode  = h265->qpmap_mode;

    return MPP_OK;
}